

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# si_function.hpp
# Opt level: O2

vector __thiscall
sisl::si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3>::grad
          (si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3> *this,double d0,...)

{
  Scalar SVar1;
  char in_AL;
  Scalar *pSVar2;
  uint uVar3;
  undefined8 in_RCX;
  ulong uVar4;
  undefined8 in_RDX;
  Index extraout_RDX;
  long *in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  uint i;
  long index;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  vector vVar5;
  va_list vl;
  vector V;
  int local_dc;
  Scalar local_d8 [4];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_dc = 3;
  local_d8[2] = (Scalar)in_RDX;
  local_d8[3] = (Scalar)in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&V,&local_dc);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&V,0);
  *pSVar2 = d0;
  vl[0].overflow_arg_area = &stack0x00000008;
  uVar3 = 0x40;
  for (index = 1; index != 3; index = index + 1) {
    uVar4 = (ulong)uVar3;
    if (uVar4 < 0xa1) {
      uVar3 = uVar3 + 0x10;
      pSVar2 = (Scalar *)((long)local_d8 + uVar4);
    }
    else {
      pSVar2 = (Scalar *)vl[0].overflow_arg_area;
      vl[0].overflow_arg_area = (void *)((long)vl[0].overflow_arg_area + 8);
    }
    SVar1 = *pSVar2;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&V,index);
    *pSVar2 = SVar1;
  }
  (**(code **)(*in_RSI + 0x48))(this,in_RSI,&V);
  free(V.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  vVar5.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  vVar5.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (vector)vVar5.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

virtual const vector grad(double d0, ...) const {
            va_list vl;
            vector V(N);
            V[0] = d0;

            va_start(vl, d0);
            for(unsigned int i = 1; i < N; i++) {
                V[i] = va_arg(vl, double);
            }
            va_end(vl);

            return grad(V);
        }